

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::BustItemCache(void)

{
  ImPlotContext *this;
  int iVar1;
  ImPlotPlot *pIVar2;
  ImPlotPlot *plot;
  int p;
  ImPlotContext *gp;
  
  this = GImPlot;
  plot._4_4_ = 0;
  while( true ) {
    iVar1 = ImPool<ImPlotPlot>::GetBufSize(&this->Plots);
    if (iVar1 <= plot._4_4_) break;
    pIVar2 = ImPool<ImPlotPlot>::GetByIndex(&this->Plots,plot._4_4_);
    pIVar2->ColormapIdx = 0;
    ImPool<ImPlotItem>::Clear(&pIVar2->Items);
    ImPlotLegendData::Reset(&pIVar2->LegendData);
    plot._4_4_ = plot._4_4_ + 1;
  }
  return;
}

Assistant:

void BustItemCache() {
    ImPlotContext& gp = *GImPlot;
    for (int p = 0; p < gp.Plots.GetBufSize(); ++p) {
        ImPlotPlot& plot = *gp.Plots.GetByIndex(p);
        plot.ColormapIdx = 0;
        plot.Items.Clear();
        plot.LegendData.Reset();
    }
}